

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void __thiscall FSerializer::WriteObjects(FSerializer *this)

{
  DObject *this_00;
  FWriter *this_01;
  PClass *pPVar1;
  uint i;
  ulong uVar2;
  
  if ((this->w != (FWriter *)0x0) && ((this->w->mDObjects).Count != 0)) {
    BeginArray(this,"objects");
    for (uVar2 = 0; uVar2 < (this->w->mDObjects).Count; uVar2 = uVar2 + 1) {
      this_00 = (this->w->mDObjects).Array[uVar2];
      BeginObject(this,(char *)0x0);
      FWriter::Key(this->w,"classtype");
      this_01 = this->w;
      pPVar1 = DObject::GetClass(this_00);
      FWriter::String(this_01,FName::NameData.NameArray
                              [(pPVar1->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName
                               .Index].Text);
      DObject::SerializeUserVars(this_00,this);
      (*this_00->_vptr_DObject[3])(this_00);
      DObject::CheckIfSerialized(this_00);
      EndObject(this);
    }
    EndArray(this);
    return;
  }
  return;
}

Assistant:

bool isWriting() const
	{
		return w != nullptr;
	}